

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PEFile.cpp
# Opt level: O3

RICH_DANS_HEADER * __thiscall PEFile::getRichHeaderBgn(PEFile *this,RICH_SIGNATURE *richSign)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  RICH_DANS_HEADER *pRVar3;
  long lVar4;
  undefined4 extraout_var_00;
  
  if (richSign == (RICH_SIGNATURE *)0x0) {
LAB_00124e75:
    pRVar3 = (RICH_DANS_HEADER *)0x0;
  }
  else {
    uVar1 = richSign->checksum;
    iVar2 = (*(this->super_MappedExe).super_Executable.super_AbstractByteBuffer.
              _vptr_AbstractByteBuffer[6])(this,richSign,0);
    lVar4 = CONCAT44(extraout_var,iVar2) + -0x18;
    pRVar3 = (RICH_DANS_HEADER *)0x0;
    if (lVar4 != 0) {
      do {
        iVar2 = (*(this->super_MappedExe).super_Executable.super_AbstractByteBuffer.
                  _vptr_AbstractByteBuffer[7])(this,lVar4,0x18,0);
        pRVar3 = (RICH_DANS_HEADER *)CONCAT44(extraout_var_00,iVar2);
        if (pRVar3 == (RICH_DANS_HEADER *)0x0) goto LAB_00124e75;
        if ((pRVar3->dansId ^ uVar1) == 0x536e6144) {
          return pRVar3;
        }
        lVar4 = lVar4 + -4;
      } while (lVar4 != 0);
      if ((uVar1 ^ pRVar3->dansId) != 0x536e6144) {
        pRVar3 = (RICH_DANS_HEADER *)0x0;
      }
    }
  }
  return pRVar3;
}

Assistant:

pe::RICH_DANS_HEADER* PEFile::getRichHeaderBgn(pe::RICH_SIGNATURE* richSign)
{
    if (!richSign) return NULL;

    DWORD xorkey = richSign->checksum;
    const offset_t richOffset = this->getOffset(richSign);

    pe::RICH_DANS_HEADER* dansHdr = NULL;

    offset_t offset = richOffset - sizeof(pe::RICH_DANS_HEADER);
    while (offset > 0) {
        dansHdr = (pe::RICH_DANS_HEADER*) this->getContentAt(offset, sizeof(pe::RICH_DANS_HEADER));
        if (!dansHdr) {
            break;
        }
        if (dansHdr->dansId == (pe::DANS_HDR_MAGIC ^ xorkey)) {
            break; //got it!
        }
        //walking back
        offset -= sizeof(DWORD);
    }
    if (!dansHdr || dansHdr->dansId != (pe::DANS_HDR_MAGIC ^ xorkey)) {
        return NULL; //not found
    }
    return dansHdr;
}